

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  string *psVar1;
  ostream *poVar2;
  Colour *in_RDI;
  Colour colourGuard;
  size_t in_stack_00000080;
  string *in_stack_00000088;
  ConsoleReporter *in_stack_00000090;
  ostream *poVar3;
  Code _colourCode;
  
  poVar3 = *(ostream **)(in_RDI + 0x168);
  psVar1 = getDashes_abi_cxx11_();
  poVar2 = std::operator<<(poVar3,(string *)psVar1);
  _colourCode = (Code)((ulong)poVar3 >> 0x20);
  std::operator<<(poVar2,"\n");
  Colour::Colour(in_RDI,_colourCode);
  printHeaderString(in_stack_00000090,in_stack_00000088,in_stack_00000080);
  Colour::~Colour((Colour *)0x1f0f31);
  return;
}

Assistant:

void printOpenHeader( std::string const& _name ) {
            stream  << getDashes() << "\n";
            {
                Colour colourGuard( Colour::Headers );
                printHeaderString( _name );
            }
        }